

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseAssign.h
# Opt level: O0

void Eigen::internal::
     assign_sparse_to_sparse<Eigen::SparseMatrix<double,0,int>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::SparseMatrix<double,0,int>const,Eigen::SparseMatrix<double,0,int>const>>
               (SparseMatrix<double,_0,_int> *dst,
               CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
               *src)

{
  bool bVar1;
  Scalar *pSVar2;
  InnerIterator *this;
  char *pcVar3;
  SparseMatrix<double,_0,_int> *this_00;
  int __c;
  int __c_00;
  SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  *in_RSI;
  char *pcVar4;
  char *pcVar5;
  SparseMatrix<double,_0,_int> *in_RDI;
  Scalar SVar6;
  Scalar v_1;
  InnerIterator it_1;
  Index j_1;
  SparseMatrix<double,_0,_int> temp;
  Scalar v;
  InnerIterator it;
  Index j;
  Index outerEvaluationSize;
  bool transpose;
  SrcEvaluatorType srcEvaluator;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffffda8;
  SparseMatrix<double,_0,_int> *in_stack_fffffffffffffdb0;
  binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
  *in_stack_fffffffffffffdb8;
  InnerIterator *in_stack_fffffffffffffdc0;
  Index in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  InnerIterator *in_stack_fffffffffffffdf0;
  InnerIterator local_1a8;
  char *local_140;
  Index local_138;
  Index local_130;
  SparseMatrix<double,_0,_int> local_128;
  Scalar local_e0;
  InnerIterator local_d8;
  char *local_70;
  Index local_68;
  Index local_60 [3];
  Index local_48;
  undefined1 local_39;
  char local_38 [40];
  SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  *local_10;
  SparseMatrix<double,_0,_int> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  ::evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
               *)in_stack_fffffffffffffdb0,(XprType *)in_stack_fffffffffffffda8);
  local_39 = 0;
  local_48 = CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
             ::cols((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                     *)0x1e6d31);
  bVar1 = SparseMatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
          ::isRValue(local_10);
  if (bVar1) {
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
    ::rows((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
            *)0x1e6d6c);
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
    ::cols((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
            *)0x1e6d81);
    SparseMatrix<double,_0,_int>::resize
              ((SparseMatrix<double,_0,_int> *)in_stack_fffffffffffffdc0,
               (Index)in_stack_fffffffffffffdb8,(Index)in_stack_fffffffffffffdb0);
    SparseMatrix<double,_0,_int>::setZero(in_stack_fffffffffffffdb0);
    local_60[0] = CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                  ::rows((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                          *)0x1e6dc7);
    local_68 = CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
               ::cols((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                       *)0x1e6ddc);
    std::max<long>(local_60,&local_68);
    SparseMatrix<double,_0,_int>::reserve
              (in_stack_fffffffffffffdb0,(Index)in_stack_fffffffffffffda8);
    for (local_70 = (char *)0x0; (long)local_70 < local_48; local_70 = local_70 + 1) {
      SparseMatrix<double,_0,_int>::startVec(local_8,(Index)local_70);
      pcVar4 = local_38;
      binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
      ::InnerIterator::InnerIterator
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (Index)in_stack_fffffffffffffdb0);
      while( true ) {
        bVar1 = binary_evaluator::InnerIterator::operator_cast_to_bool((InnerIterator *)&local_d8);
        if (!bVar1) break;
        SVar6 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
                ::InnerIterator::value(&local_d8);
        pcVar5 = local_70;
        local_e0 = SVar6;
        binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
        ::InnerIterator::index(&local_d8,pcVar4,__c);
        pSVar2 = SparseMatrix<double,_0,_int>::insertBackByOuterInner
                           ((SparseMatrix<double,_0,_int> *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0);
        *pSVar2 = SVar6;
        binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
        ::InnerIterator::operator++(in_stack_fffffffffffffdf0);
        pcVar4 = pcVar5;
      }
    }
    SparseMatrix<double,_0,_int>::finalize
              ((SparseMatrix<double,_0,_int> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
  }
  else {
    this = (InnerIterator *)
           CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
           ::rows((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                   *)0x1e6f95);
    CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
    ::cols((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
            *)0x1e6fa7);
    SparseMatrix<double,_0,_int>::SparseMatrix
              ((SparseMatrix<double,_0,_int> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8,(Index)in_stack_fffffffffffffdc0);
    local_130 = CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                ::rows((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                        *)0x1e6fcb);
    local_138 = CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                ::cols((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>
                        *)0x1e6fe0);
    std::max<long>(&local_130,&local_138);
    SparseMatrix<double,_0,_int>::reserve
              (in_stack_fffffffffffffdb0,(Index)in_stack_fffffffffffffda8);
    for (local_140 = (char *)0x0; (long)local_140 < local_48; local_140 = local_140 + 1) {
      SparseMatrix<double,_0,_int>::startVec(&local_128,(Index)local_140);
      pcVar4 = local_38;
      binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
      ::InnerIterator::InnerIterator
                (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
                 (Index)in_stack_fffffffffffffdb0);
      while( true ) {
        bVar1 = binary_evaluator::InnerIterator::operator_cast_to_bool((InnerIterator *)&local_1a8);
        if (!bVar1) break;
        in_stack_fffffffffffffdc0 =
             (InnerIterator *)
             binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
             ::InnerIterator::value(&local_1a8);
        pcVar5 = local_140;
        pcVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
                 ::InnerIterator::index(&local_1a8,pcVar4,__c_00);
        pcVar4 = pcVar5;
        in_stack_fffffffffffffdd4 = SUB84(pcVar3,0);
        in_stack_fffffffffffffdb8 =
             (binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
              *)SparseMatrix<double,_0,_int>::insertBackByOuterInner
                          ((SparseMatrix<double,_0,_int> *)
                           CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                           (Index)pcVar4,(Index)in_stack_fffffffffffffdc0);
        *(InnerIterator **)in_stack_fffffffffffffdb8 = in_stack_fffffffffffffdc0;
        binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>,_Eigen::internal::IteratorBased,_Eigen::internal::IteratorBased,_double,_double>
        ::InnerIterator::operator++(this);
      }
    }
    SparseMatrix<double,_0,_int>::finalize
              ((SparseMatrix<double,_0,_int> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    this_00 = SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::markAsRValue
                        ((SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)0x1e7188);
    SparseMatrix<double,_0,_int>::operator=(this_00,in_stack_fffffffffffffda8);
    SparseMatrix<double,_0,_int>::~SparseMatrix(this_00);
  }
  evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
  ::~evaluator((evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::SparseMatrix<double,_0,_int>,_const_Eigen::SparseMatrix<double,_0,_int>_>_>
                *)0x1e71bd);
  return;
}

Assistant:

void assign_sparse_to_sparse(DstXprType &dst, const SrcXprType &src)
{
  typedef typename DstXprType::Scalar Scalar;
  typedef internal::evaluator<DstXprType> DstEvaluatorType;
  typedef internal::evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  const bool transpose = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit);
  const Index outerEvaluationSize = (SrcEvaluatorType::Flags&RowMajorBit) ? src.rows() : src.cols();
  if ((!transpose) && src.isRValue())
  {
    // eval without temporary
    dst.resize(src.rows(), src.cols());
    dst.setZero();
    dst.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      dst.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        dst.insertBackByOuterInner(j,it.index()) = v;
      }
    }
    dst.finalize();
  }
  else
  {
    // eval through a temporary
    eigen_assert(( ((internal::traits<DstXprType>::SupportedAccessPatterns & OuterRandomAccessPattern)==OuterRandomAccessPattern) ||
              (!((DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit)))) &&
              "the transpose operation is supposed to be handled in SparseMatrix::operator=");

    enum { Flip = (DstEvaluatorType::Flags & RowMajorBit) != (SrcEvaluatorType::Flags & RowMajorBit) };

    
    DstXprType temp(src.rows(), src.cols());

    temp.reserve((std::max)(src.rows(),src.cols())*2);
    for (Index j=0; j<outerEvaluationSize; ++j)
    {
      temp.startVec(j);
      for (typename SrcEvaluatorType::InnerIterator it(srcEvaluator, j); it; ++it)
      {
        Scalar v = it.value();
        temp.insertBackByOuterInner(Flip?it.index():j,Flip?j:it.index()) = v;
      }
    }
    temp.finalize();

    dst = temp.markAsRValue();
  }
}